

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t uprv_strCompare_63(UChar *s1,int32_t length1,UChar *s2,int32_t length2,UBool strncmpStyle,
                          UBool codePointOrder)

{
  bool bVar1;
  uint uVar2;
  UChar *t;
  UChar *pUVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  UChar *pUVar6;
  UChar *pUVar7;
  long lVar8;
  UChar UVar9;
  int iVar10;
  UChar *pUVar11;
  UChar in_R11W;
  
  pUVar6 = (UChar *)CONCAT44(in_register_0000000c,length2);
  pUVar7 = s1;
  pUVar11 = s2;
  if ((length2 & length1) < 0) {
    if (s1 == s2) {
      return 0;
    }
    UVar9 = *s1;
    in_R11W = *s2;
    if (UVar9 == in_R11W) {
      do {
        if (UVar9 == L'\0') {
          return 0;
        }
        UVar9 = pUVar7[1];
        pUVar7 = pUVar7 + 1;
        in_R11W = pUVar11[1];
        pUVar11 = pUVar11 + 1;
      } while (UVar9 == in_R11W);
    }
    pUVar3 = (UChar *)0x0;
    pUVar6 = (UChar *)0x0;
  }
  else if (strncmpStyle == '\0') {
    if (length1 < 0) {
      length1 = -1;
      pUVar3 = s1;
      do {
        length1 = length1 + 1;
        UVar9 = *pUVar3;
        pUVar3 = pUVar3 + 1;
      } while (UVar9 != L'\0');
    }
    if (length2 < 0) {
      pUVar6 = (UChar *)0xffffffff;
      pUVar3 = s2;
      do {
        pUVar6 = (UChar *)(ulong)((int)pUVar6 + 1);
        UVar9 = *pUVar3;
        pUVar3 = pUVar3 + 1;
      } while (UVar9 != L'\0');
    }
    iVar4 = (int)pUVar6;
    iVar10 = iVar4;
    if (length1 < iVar4) {
      iVar10 = length1;
    }
    uVar2 = 0xffffffff;
    if (iVar4 <= length1) {
      uVar2 = (uint)(length1 != iVar4);
    }
    pUVar3 = s1 + iVar10;
    UVar9 = (UChar)(s1 == s2);
    if (iVar10 == 0 || s1 == s2) {
      bVar1 = false;
    }
    else {
      lVar8 = (long)iVar10 * 2;
      do {
        UVar9 = *pUVar7;
        in_R11W = *pUVar11;
        if (UVar9 != in_R11W) {
          pUVar3 = s1 + length1;
          pUVar6 = s2 + iVar4;
          bVar1 = true;
          goto LAB_002d27e7;
        }
        pUVar7 = pUVar7 + 1;
        pUVar11 = pUVar11 + 1;
        lVar8 = lVar8 + -2;
      } while (lVar8 != 0);
      bVar1 = false;
    }
LAB_002d27e7:
    if (!bVar1) {
      return uVar2;
    }
  }
  else {
    if (s1 == s2) {
      return 0;
    }
    if (length1 == 0) {
      return 0;
    }
    lVar5 = (long)length1;
    pUVar3 = s1 + lVar5;
    lVar8 = lVar5 * 2;
    while( true ) {
      lVar8 = lVar8 + -2;
      UVar9 = *pUVar7;
      in_R11W = *pUVar11;
      if (UVar9 != in_R11W) break;
      if (UVar9 == L'\0') {
        return 0;
      }
      pUVar7 = pUVar7 + 1;
      pUVar11 = pUVar11 + 1;
      if (lVar8 == 0) {
        return 0;
      }
    }
    pUVar6 = s2 + lVar5;
  }
  if (((codePointOrder != '\0') && (0xd7ff < (ushort)UVar9)) && (0xd7ff < (ushort)in_R11W)) {
    if ((((0xdbff < (ushort)UVar9) || (pUVar7 + 1 == pUVar3)) || ((pUVar7[1] & 0xfc00U) != 0xdc00))
       && ((pUVar7 == s1 || (UVar9 & 0xfc00U) != 0xdc00 || ((pUVar7[-1] & 0xfc00U) != 0xd800)))) {
      UVar9 = UVar9 + L'\xd800';
    }
    if ((((0xdbff < (ushort)in_R11W) || (pUVar11 + 1 == pUVar6)) ||
        ((pUVar11[1] & 0xfc00U) != 0xdc00)) &&
       ((pUVar11 == s2 || (in_R11W & 0xfc00U) != 0xdc00 || ((pUVar11[-1] & 0xfc00U) != 0xd800)))) {
      in_R11W = in_R11W + L'\xd800';
    }
  }
  return (uint)(ushort)UVar9 - (uint)(ushort)in_R11W;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
uprv_strCompare(const UChar *s1, int32_t length1,
                const UChar *s2, int32_t length2,
                UBool strncmpStyle, UBool codePointOrder) {
    const UChar *start1, *start2, *limit1, *limit2;
    UChar c1, c2;

    /* setup for fix-up */
    start1=s1;
    start2=s2;

    /* compare identical prefixes - they do not need to be fixed up */
    if(length1<0 && length2<0) {
        /* strcmp style, both NUL-terminated */
        if(s1==s2) {
            return 0;
        }

        for(;;) {
            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=limit2=NULL;
    } else if(strncmpStyle) {
        /* special handling for strncmp, assume length1==length2>=0 but also check for NUL */
        if(s1==s2) {
            return 0;
        }

        limit1=start1+length1;

        for(;;) {
            /* both lengths are same, check only one limit */
            if(s1==limit1) {
                return 0;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit2=start2+length1; /* use length1 here, too, to enforce assumption */
    } else {
        /* memcmp/UnicodeString style, both length-specified */
        int32_t lengthResult;

        if(length1<0) {
            length1=u_strlen(s1);
        }
        if(length2<0) {
            length2=u_strlen(s2);
        }

        /* limit1=start1+min(lenght1, length2) */
        if(length1<length2) {
            lengthResult=-1;
            limit1=start1+length1;
        } else if(length1==length2) {
            lengthResult=0;
            limit1=start1+length1;
        } else /* length1>length2 */ {
            lengthResult=1;
            limit1=start1+length2;
        }

        if(s1==s2) {
            return lengthResult;
        }

        for(;;) {
            /* check pseudo-limit */
            if(s1==limit1) {
                return lengthResult;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=start1+length1;
        limit2=start2+length2;
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && (s1+1)!=limit1 && U16_IS_TRAIL(*(s1+1))) ||
            (U16_IS_TRAIL(c1) && start1!=s1 && U16_IS_LEAD(*(s1-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && (s2+1)!=limit2 && U16_IS_TRAIL(*(s2+1))) ||
            (U16_IS_TRAIL(c2) && start2!=s2 && U16_IS_LEAD(*(s2-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}